

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTS_label.c
# Opt level: O3

void HTS_Label_load_from_strings
               (HTS_Label *label,size_t sampling_rate,size_t fperiod,char **lines,size_t num_lines)

{
  int iVar1;
  ushort **ppuVar2;
  HTS_LabelString *pHVar3;
  char *pcVar4;
  HTS_LabelString *pHVar5;
  size_t sVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  double dVar9;
  size_t data_index;
  int i;
  char buff [1024];
  size_t local_468;
  undefined1 local_45c [4];
  double local_458;
  double local_448;
  char local_438 [1032];
  
  if ((label->head != (HTS_LabelString *)0x0) || (label->size != 0)) {
    HTS_error(1,"HTS_Label_load_from_fp: label list is not initialized.\n");
    return;
  }
  if (num_lines == 0) {
    pHVar5 = (HTS_LabelString *)0x0;
  }
  else {
    auVar7._8_4_ = (int)(sampling_rate >> 0x20);
    auVar7._0_8_ = sampling_rate;
    auVar7._12_4_ = 0x45300000;
    auVar8._8_4_ = (int)(fperiod >> 0x20);
    auVar8._0_8_ = fperiod;
    auVar8._12_4_ = 0x45300000;
    dVar9 = ((auVar7._8_8_ - 1.9342813113834067e+25) +
            ((double)CONCAT44(0x43300000,(int)sampling_rate) - 4503599627370496.0)) /
            (((auVar8._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)fperiod) - 4503599627370496.0)) * 10000000.0);
    ppuVar2 = __ctype_b_loc();
    sVar6 = 0;
    pHVar5 = (HTS_LabelString *)0x0;
    do {
      if (-1 < (short)(*ppuVar2)[*lines[sVar6]]) break;
      label->size = label->size + 1;
      pHVar3 = (HTS_LabelString *)HTS_calloc(1,0x20);
      if (pHVar5 == (HTS_LabelString *)0x0) {
        pHVar5 = (HTS_LabelString *)label;
      }
      pHVar5->next = pHVar3;
      local_468 = 0;
      iVar1 = __isoc99_sscanf(lines[sVar6],"%d",local_45c);
      if (iVar1 == 1) {
        HTS_get_token_from_string(lines[sVar6],&local_468,local_438);
        local_448 = atof(local_438);
        HTS_get_token_from_string(lines[sVar6],&local_468,local_438);
        local_458 = atof(local_438);
        HTS_get_token_from_string(lines[sVar6],&local_468,local_438);
        pcVar4 = HTS_strdup(local_438);
        pHVar3->start = local_448 * dVar9;
        pHVar3->end = local_458 * dVar9;
      }
      else {
        pHVar3->start = -1.0;
        pHVar3->end = -1.0;
        pcVar4 = HTS_strdup(lines[sVar6]);
      }
      pHVar3->name = pcVar4;
      pHVar3->next = (_HTS_LabelString *)0x0;
      sVar6 = sVar6 + 1;
      pHVar5 = pHVar3;
    } while (num_lines != sVar6);
    pHVar5 = label->head;
  }
  HTS_Label_check_time((HTS_Label *)pHVar5);
  return;
}

Assistant:

void HTS_Label_load_from_strings(HTS_Label * label, size_t sampling_rate, size_t fperiod, char **lines, size_t num_lines)
{
   char buff[HTS_MAXBUFLEN];
   HTS_LabelString *lstring = NULL;
   size_t i;
   size_t data_index;
   double start, end;
   const double rate = (double) sampling_rate / ((double) fperiod * 1e+7);

   if (label->head || label->size != 0) {
      HTS_error(1, "HTS_Label_load_from_fp: label list is not initialized.\n");
      return;
   }
   /* copy label */
   for (i = 0; i < num_lines; i++) {
      if (!isgraph((int) lines[i][0]))
         break;
      label->size++;

      if (lstring) {
         lstring->next = (HTS_LabelString *) HTS_calloc(1, sizeof(HTS_LabelString));
         lstring = lstring->next;
      } else {                  /* first time */
         lstring = (HTS_LabelString *) HTS_calloc(1, sizeof(HTS_LabelString));
         label->head = lstring;
      }
      data_index = 0;
      if (isdigit_string(lines[i])) {   /* has frame infomation */
         HTS_get_token_from_string(lines[i], &data_index, buff);
         start = atof(buff);
         HTS_get_token_from_string(lines[i], &data_index, buff);
         end = atof(buff);
         HTS_get_token_from_string(lines[i], &data_index, buff);
         lstring->name = HTS_strdup(buff);
         lstring->start = rate * start;
         lstring->end = rate * end;
      } else {
         lstring->start = -1.0;
         lstring->end = -1.0;
         lstring->name = HTS_strdup(lines[i]);
      }
      lstring->next = NULL;
   }
   HTS_Label_check_time(label);
}